

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangleMeshConnected::addTriangle
          (ChTriangleMeshConnected *this,ChTriangle *atriangle)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  ChVector<int> local_2c;
  
  pCVar1 = (this->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_vertices;
  pCVar2 = (this->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            (this_00,&atriangle->p1);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            (this_00,&atriangle->p2);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            (this_00,&atriangle->p3);
  local_2c.m_data[0] = (int)(((long)pCVar1 - (long)pCVar2) / 0x18);
  local_2c.m_data[1] = local_2c.m_data[0] + 1;
  local_2c.m_data[2] = local_2c.m_data[0] + 2;
  std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
  emplace_back<chrono::ChVector<int>>
            ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &this->m_face_v_indices,&local_2c);
  return;
}

Assistant:

void ChTriangleMeshConnected::addTriangle(const ChTriangle& atriangle) {
    int base_v = (int)m_vertices.size();
    m_vertices.push_back(atriangle.p1);
    m_vertices.push_back(atriangle.p2);
    m_vertices.push_back(atriangle.p3);
    m_face_v_indices.push_back(ChVector<int>(base_v, base_v + 1, base_v + 2));
}